

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
~ExceptionOr(ExceptionOr<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
             *this)

{
  ExceptionOr<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  *this_local;
  
  Maybe<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::~Maybe
            (&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;